

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParseComment(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  xmlParserInputState xVar3;
  xmlParserInputPtr pxVar4;
  commentSAXFunc p_Var5;
  xmlChar *pxVar6;
  int iVar7;
  uint val;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  xmlChar *pxVar12;
  ulong uVar13;
  xmlChar *pxVar14;
  bool bVar15;
  int l;
  int rl;
  int ql;
  int nl;
  int local_60;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  uint local_34;
  
  if (ctxt->token != 0) {
    return;
  }
  pxVar4 = ctxt->input;
  pxVar12 = pxVar4->cur;
  if (*pxVar12 != '<') {
    return;
  }
  if (pxVar12[1] != '!') {
    return;
  }
  if (pxVar12[2] != '-') {
    return;
  }
  if (pxVar12[3] != '-') {
    return;
  }
  xVar3 = ctxt->instate;
  ctxt->instate = XML_PARSER_COMMENT;
  if ((500 < (long)pxVar12 - (long)pxVar4->base) && ((long)pxVar4->end - (long)pxVar12 < 500)) {
    xmlParserInputShrink(pxVar4);
  }
  pxVar4 = ctxt->input;
  ppxVar1 = &pxVar4->cur;
  *ppxVar1 = *ppxVar1 + 4;
  piVar2 = &pxVar4->col;
  *piVar2 = *piVar2 + 4;
  pxVar12 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar12 == (xmlChar *)0x0) {
    htmlErrMemory(ctxt,"buffer allocation failed\n");
    ctxt->instate = xVar3;
    return;
  }
  *pxVar12 = '\0';
  val = htmlCurrentChar(ctxt,&local_48);
  if (val == 0) goto LAB_0014c40e;
  if (val == 0x3e) {
LAB_0014c391:
    htmlParseErr(ctxt,XML_ERR_COMMENT_ABRUPTLY_ENDED,"Comment abruptly ended",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    bVar15 = true;
    uVar13 = 0;
  }
  else {
    pxVar4 = ctxt->input;
    pxVar14 = pxVar4->cur;
    if (*pxVar14 == '\n') {
      pxVar4->line = pxVar4->line + 1;
      pxVar4->col = 1;
    }
    else {
      pxVar4->col = pxVar4->col + 1;
    }
    ctxt->token = 0;
    pxVar4->cur = pxVar14 + local_48;
    uVar8 = htmlCurrentChar(ctxt,&local_4c);
    if (uVar8 == 0) goto LAB_0014c40e;
    if (uVar8 == 0x3e && val == 0x2d) goto LAB_0014c391;
    pxVar4 = ctxt->input;
    pxVar14 = pxVar4->cur;
    if (*pxVar14 == '\n') {
      pxVar4->line = pxVar4->line + 1;
      pxVar4->col = 1;
    }
    else {
      pxVar4->col = pxVar4->col + 1;
    }
    ctxt->token = 0;
    pxVar4->cur = pxVar14 + local_4c;
    uVar9 = htmlCurrentChar(ctxt,&local_50);
    if (uVar9 == 0) {
      bVar15 = false;
      uVar13 = 0;
    }
    else {
      local_60 = 100;
      uVar13 = 0;
      pxVar14 = pxVar12;
      do {
        bVar15 = (uVar9 == 0x3e && (uVar8 ^ 0x2d) == 0) && (val ^ 0x2d) == 0;
        pxVar12 = pxVar14;
        local_40 = uVar13;
        if (bVar15) break;
        pxVar4 = ctxt->input;
        pxVar6 = pxVar4->cur;
        if (*pxVar6 == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
        }
        else {
          pxVar4->col = pxVar4->col + 1;
        }
        ctxt->token = 0;
        pxVar4->cur = pxVar6 + local_50;
        uVar10 = htmlCurrentChar(ctxt,&local_44);
        if (uVar10 == 0) {
          pxVar4 = ctxt->input;
          if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
             ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
            xmlParserInputShrink(pxVar4);
          }
          if ((ctxt->progressive == 0) &&
             (pxVar4 = ctxt->input, (long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
            xmlParserInputGrow(pxVar4,0xfa);
          }
          uVar10 = htmlCurrentChar(ctxt,&local_44);
        }
        uVar13 = local_40;
        local_34 = uVar10;
        if (uVar10 == 0x3e && (uVar9 == 0x21 && ((val ^ 0x2d) == 0 && (uVar8 ^ 0x2d) == 0))) {
          htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment incorrectly closed by \'--!>\'",
                       (xmlChar *)0x0,(xmlChar *)0x0);
          bVar15 = true;
          uVar13 = local_40;
          break;
        }
        iVar7 = (int)local_40;
        iVar11 = local_60;
        if (local_60 <= iVar7 + 5) {
          pxVar12 = (xmlChar *)(*xmlRealloc)(pxVar14,(long)(local_60 * 2));
          local_60 = local_60 * 2;
          if (pxVar12 == (xmlChar *)0x0) {
            (*xmlFree)(pxVar14);
            htmlErrMemory(ctxt,"growing buffer failed\n");
            ctxt->instate = xVar3;
            return;
          }
        }
        if ((int)val < 0x100) {
          if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0))))
          goto LAB_0014c65f;
LAB_0014c617:
          if (local_48 == 1) {
            uVar13 = (ulong)(iVar7 + 1);
            pxVar12[iVar7] = (xmlChar)val;
          }
          else {
            iVar11 = xmlCopyChar(local_48,pxVar12 + iVar7,val);
            uVar13 = (ulong)(uint)(iVar11 + iVar7);
          }
        }
        else {
          uVar10 = val - 0xe000;
          iVar11 = CONCAT31((int3)(uVar10 >> 8),uVar10 < 0x1ffe);
          if ((val - 0x10000 < 0x100000 || uVar10 < 0x1ffe) || (int)val < 0xd800) goto LAB_0014c617;
LAB_0014c65f:
          htmlParseErrInt(ctxt,0x1f0803,(char *)(ulong)val,iVar11);
        }
        local_48 = local_4c;
        local_4c = local_50;
        local_50 = local_44;
        pxVar14 = pxVar12;
        val = uVar8;
        uVar8 = uVar9;
        uVar9 = local_34;
      } while (local_34 != 0);
    }
  }
  pxVar12[(int)uVar13] = '\0';
  if (bVar15) {
    xmlNextChar(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var5 = ctxt->sax->comment, p_Var5 != (commentSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
      (*p_Var5)(ctxt->userData,pxVar12);
    }
    (*xmlFree)(pxVar12);
    ctxt->instate = xVar3;
    return;
  }
LAB_0014c40e:
  htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment not terminated \n<!--%.50s\n",pxVar12,
               (xmlChar *)0x0);
  (*xmlFree)(pxVar12);
  return;
}

Assistant:

static void
htmlParseComment(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len;
    int size = HTML_PARSER_BUFFER_SIZE;
    int q, ql;
    int r, rl;
    int cur, l;
    int next, nl;
    xmlParserInputState state;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;

    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    SHRINK;
    SKIP(4);
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        htmlErrMemory(ctxt, "buffer allocation failed\n");
	ctxt->instate = state;
	return;
    }
    len = 0;
    buf[len] = 0;
    q = CUR_CHAR(ql);
    if (q == 0)
        goto unfinished;
    if (q == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto unfinished;
    if (q == '-' && r == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    while ((cur != 0) &&
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	NEXTL(l);
	next = CUR_CHAR(nl);
	if (next == 0) {
	    SHRINK;
	    GROW;
	    next = CUR_CHAR(nl);
	}

	if ((q == '-') && (r == '-') && (cur == '!') && (next == '>')) {
	  htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		       "Comment incorrectly closed by '--!>'", NULL, NULL);
	  cur = '>';
	  break;
	}

	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
	        htmlErrMemory(ctxt, "growing buffer failed\n");
		ctxt->instate = state;
		return;
	    }
	    buf = tmp;
	}
        if (IS_CHAR(q)) {
	    COPY_BUF(ql,buf,len,q);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in comment 0x%X\n", q);
        }

	q = r;
	ql = rl;
	r = cur;
	rl = l;
	cur = next;
	l = nl;
    }
finished:
    buf[len] = 0;
    if (cur == '>') {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
	xmlFree(buf);
	ctxt->instate = state;
	return;
    }

unfinished:
    htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		 "Comment not terminated \n<!--%.50s\n", buf, NULL);
    xmlFree(buf);
}